

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_die_CU_offset_range
              (Dwarf_Die die,Dwarf_Off *cu_off,Dwarf_Off *cu_length,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_CU_Context_conflict pDVar2;
  Dwarf_Debug ckdi_dbg;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Error *error_local;
  Dwarf_Off *cu_length_local;
  Dwarf_Off *cu_off_local;
  Dwarf_Die die_local;
  
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    pDVar1 = die->di_cu_context->cc_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      pDVar2 = die->di_cu_context;
      *cu_off = pDVar2->cc_debug_offset;
      *cu_length = pDVar2->cc_length + (ulong)pDVar2->cc_length_size +
                   (ulong)pDVar2->cc_extension_size;
      die_local._4_4_ = 0;
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_die_CU_offset_range(Dwarf_Die die,
    Dwarf_Off   *cu_off,
    Dwarf_Off   *cu_length,
    Dwarf_Error *error)
{
    Dwarf_CU_Context cu_context = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    cu_context = die->di_cu_context;

    *cu_off = cu_context->cc_debug_offset;
    *cu_length = cu_context->cc_length + cu_context->cc_length_size
        + cu_context->cc_extension_size;
    return DW_DLV_OK;
}